

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::GenvarDeclarationSyntax::GenvarDeclarationSyntax
          (GenvarDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *identifiers,Token semi)

{
  bool bVar1;
  IdentifierNameSyntax *pIVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *in_RDI;
  IdentifierNameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffc0 [16];
  MemberSyntax *in_stack_ffffffffffffffd0;
  
  rhs = (SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_,
             in_stack_ffffffffffffffc0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RDX;
  in_RDI[1].super_SyntaxListBase.childCount = in_RCX;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_ptr = (pointer)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].elements._M_extent._M_extent_value =
       *(size_t *)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x56cc99);
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pIVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                          *)0x56ccd8);
    (pIVar2->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)in_RDI
    ;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

GenvarDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<IdentifierNameSyntax>& identifiers, Token semi) :
        MemberSyntax(SyntaxKind::GenvarDeclaration, attributes), keyword(keyword), identifiers(identifiers), semi(semi) {
        this->identifiers.parent = this;
        for (auto child : this->identifiers)
            child->parent = this;
    }